

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sexp.c
# Opt level: O0

sexp sexp_lookup_type_op(sexp ctx,sexp self,sexp_sint_t n,sexp name,sexp id)

{
  ulong uVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  int iVar5;
  char *__s1;
  int *in_RCX;
  long in_RDI;
  sexp in_R8;
  char *str;
  sexp res;
  int i;
  sexp in_stack_ffffffffffffffb8;
  sexp_uint_t in_stack_ffffffffffffffc0;
  sexp psVar6;
  undefined4 in_stack_ffffffffffffffc8;
  undefined4 in_stack_ffffffffffffffcc;
  int iVar7;
  sexp local_8;
  
  if ((((ulong)in_RCX & 3) == 0) && (*in_RCX == 9)) {
    __s1 = (char *)(*(long *)(in_RCX + 2) + 0x10 + *(long *)(in_RCX + 4));
    if (((ulong)in_R8 & 1) == 1) {
      auVar2._8_8_ = (long)in_R8 >> 0x3f;
      auVar2._0_8_ = (ulong)in_R8 & 0xfffffffffffffffe;
      iVar7 = SUB164(auVar2 / SEXT816(2),0);
      uVar1 = *(ulong *)(*(long *)(in_RDI + 0x28) + 0x30);
      auVar3._8_8_ = (long)uVar1 >> 0x3f;
      auVar3._0_8_ = uVar1 & 0xfffffffffffffffe;
      if (((long)iVar7 < SUB168(auVar3 / SEXT816(2),0)) &&
         (iVar5 = strcmp(__s1,(char *)(*(long *)(*(long *)(*(long *)(*(long *)(*(long *)(in_RDI + 
                                                  0x28) + 0x20) + 0x10 + (long)iVar7 * 8) + 8) + 8)
                                       + 0x10 + *(long *)(*(long *)(*(long *)(*(long *)(*(long *)(
                                                  in_RDI + 0x28) + 0x20) + 0x10 + (long)iVar7 * 8) +
                                                  8) + 0x10))), iVar5 == 0)) {
        local_8 = *(sexp *)(*(long *)(*(long *)(in_RDI + 0x28) + 0x20) + 0x10 + (long)iVar7 * 8);
      }
      else {
        local_8 = (sexp)&DAT_0000003e;
      }
    }
    else {
      uVar1 = *(ulong *)(*(long *)(in_RDI + 0x28) + 0x30);
      auVar4._8_8_ = (long)uVar1 >> 0x3f;
      auVar4._0_8_ = uVar1 & 0xfffffffffffffffe;
      iVar7 = SUB164(auVar4 / SEXT816(2),0);
      while (iVar7 = iVar7 + -1, -1 < iVar7) {
        iVar5 = strcmp(__s1,(char *)(*(long *)(*(long *)(*(long *)(*(long *)(*(long *)(in_RDI + 0x28
                                                                                      ) + 0x20) +
                                                                   0x10 + (long)iVar7 * 8) + 8) + 8)
                                     + 0x10 + *(long *)(*(long *)(*(long *)(*(long *)(*(long *)(
                                                  in_RDI + 0x28) + 0x20) + 0x10 + (long)iVar7 * 8) +
                                                  8) + 0x10)));
        if (iVar5 == 0) {
          psVar6 = *(sexp *)(*(long *)(*(long *)(in_RDI + 0x28) + 0x20) + 0x10 + (long)iVar7 * 8);
          if (((ulong)in_R8 & 3) != 0) {
            return psVar6;
          }
          if (in_R8->tag != 9) {
            return psVar6;
          }
          if (((((ulong)(psVar6->value).type.id & 3) == 0) && (((psVar6->value).type.id)->tag == 9))
             && (iVar5 = strcmp((((in_R8->value).type.name)->value).flonum_bits + 8 +
                                (long)(in_R8->value).type.cpl,
                                (((((psVar6->value).type.id)->value).type.name)->value).flonum_bits
                                + 8 + (long)(((psVar6->value).type.id)->value).type.cpl), iVar5 == 0
                )) {
            return psVar6;
          }
        }
      }
      local_8 = (sexp)&DAT_0000003e;
    }
  }
  else {
    local_8 = sexp_type_exception(in_R8,(sexp)CONCAT44(in_stack_ffffffffffffffcc,
                                                       in_stack_ffffffffffffffc8),
                                  in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
  }
  return local_8;
}

Assistant:

sexp sexp_lookup_type_op(sexp ctx, sexp self, sexp_sint_t n, sexp name, sexp id) {
  int i;
  sexp res;
  const char* str;
  sexp_assert_type(ctx, sexp_stringp, SEXP_STRING, name);
  str = sexp_string_data(name);
  if (sexp_fixnump(id)) {
    i = sexp_unbox_fixnum(id);
    if (i < sexp_context_num_types(ctx)
        && strcmp(str, sexp_string_data(sexp_type_name_by_index(ctx, i))) == 0)
      return sexp_type_by_index(ctx, i);
    else
      return SEXP_FALSE;
  }
  for (i=sexp_context_num_types(ctx)-1; i>=0; i--)
    if (strcmp(str, sexp_string_data(sexp_type_name_by_index(ctx, i))) == 0) {
      res = sexp_type_by_index(ctx, i);
      if (sexp_stringp(id)
          && !(sexp_stringp(sexp_type_id(res))
               && strcmp(sexp_string_data(id), sexp_string_data(sexp_type_id(res))) == 0))
        continue;
      return res;
    }
  return SEXP_FALSE;
}